

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Print(VirtualMachine *this)

{
  ostream *poVar1;
  Variable VVar2;
  string local_40;
  VariableType VStack_20;
  Variable var;
  VirtualMachine *this_local;
  
  var.field_1 = (anon_union_8_6_52c89740_for_Variable_1)this;
  VVar2 = popOpStack(this);
  var._0_8_ = VVar2.field_1;
  VStack_20 = VVar2.type;
  poVar1 = this->out;
  VVar2._4_4_ = 0;
  VVar2.type = VStack_20;
  VVar2.field_1.integerValue = var._0_8_;
  variableToString_abi_cxx11_(&local_40,this,VVar2,true);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pushUndefined(this);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::Print() {
  Variable var = this->popOpStack();
  this->out << this->variableToString(var, true);
  this->pushUndefined();
  this->advance();
}